

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigAddToPatScores(Ivy_FraigMan_t *p,Ivy_Obj_t *pClass,Ivy_Obj_t *pClassNew)

{
  uint uVar1;
  Ivy_FraigSim_t *pIVar2;
  Ivy_FraigSim_t *pIVar3;
  int iVar4;
  int local_3c;
  int local_38;
  int w;
  int i;
  uint uDiff;
  Ivy_FraigSim_t *pSims1;
  Ivy_FraigSim_t *pSims0;
  Ivy_Obj_t *pClassNew_local;
  Ivy_Obj_t *pClass_local;
  Ivy_FraigMan_t *p_local;
  
  pIVar2 = Ivy_ObjSim(pClass);
  pIVar3 = Ivy_ObjSim(pClassNew);
  for (local_3c = 0; local_3c < p->nSimWords; local_3c = local_3c + 1) {
    uVar1 = (&pIVar2[1].Type)[local_3c] ^ (&pIVar3[1].Type)[local_3c];
    if (uVar1 != 0) {
      for (local_38 = 0; local_38 < 0x20; local_38 = local_38 + 1) {
        if ((uVar1 & 1 << ((byte)local_38 & 0x1f)) != 0) {
          iVar4 = local_3c * 0x20 + local_38;
          p->pPatScores[iVar4] = p->pPatScores[iVar4] + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void Ivy_FraigAddToPatScores( Ivy_FraigMan_t * p, Ivy_Obj_t * pClass, Ivy_Obj_t * pClassNew )
{
    Ivy_FraigSim_t * pSims0, * pSims1;
    unsigned uDiff;
    int i, w;
    // get hold of the simulation information
    pSims0 = Ivy_ObjSim(pClass);
    pSims1 = Ivy_ObjSim(pClassNew);
    // iterate through the differences and record the score
    for ( w = 0; w < p->nSimWords; w++ )
    {
        uDiff = pSims0->pData[w] ^ pSims1->pData[w];
        if ( uDiff == 0 )
            continue;
        for ( i = 0; i < 32; i++ )
            if ( uDiff & ( 1 << i ) )
                p->pPatScores[w*32+i]++;
    }
}